

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

pair<std::byte_*,_unsigned_long> __thiscall
BufferedFile::AdvanceStream(BufferedFile *this,size_t length)

{
  ulong uVar1;
  pointer pbVar2;
  unsigned_long *__result;
  ulong *puVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  pair<std::byte_*,_unsigned_long> pVar8;
  size_t local_38 [4];
  
  puVar3 = local_38;
  local_38[3] = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->m_read_pos;
  if (this->nSrcPos < uVar1) {
    __assert_fail("m_read_pos <= nSrcPos",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/streams.h"
                  ,0x1f7,"std::pair<std::byte *, size_t> BufferedFile::AdvanceStream(size_t)");
  }
  if (this->nReadLimit < uVar1 + length) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    local_38[1] = std::iostream_category();
    local_38[0] = CONCAT44(local_38[0]._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"Attempt to position past buffer limit");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38[3]) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if (length != 0 && uVar1 == this->nSrcPos) {
      Fill(this);
    }
    uVar1 = this->m_read_pos;
    pbVar2 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pbVar2;
    uVar5 = uVar1 % uVar7;
    local_38[0] = length;
    local_38[1] = uVar7 - uVar5;
    local_38[2] = this->nSrcPos - uVar1;
    lVar6 = 8;
    do {
      if (*(ulong *)((long)local_38 + lVar6) < *puVar3) {
        puVar3 = (ulong *)((long)local_38 + lVar6);
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x18);
    uVar7 = *puVar3;
    this->m_read_pos = uVar1 + uVar7;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38[3]) {
      pVar8.second = uVar7;
      pVar8.first = pbVar2 + uVar5;
      return pVar8;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::pair<std::byte*, size_t> AdvanceStream(size_t length)
    {
        assert(m_read_pos <= nSrcPos);
        if (m_read_pos + length > nReadLimit) {
            throw std::ios_base::failure("Attempt to position past buffer limit");
        }
        // If there are no bytes available, read from the file.
        if (m_read_pos == nSrcPos && length > 0) Fill();

        size_t buffer_offset{static_cast<size_t>(m_read_pos % vchBuf.size())};
        size_t buffer_available{static_cast<size_t>(vchBuf.size() - buffer_offset)};
        size_t bytes_until_source_pos{static_cast<size_t>(nSrcPos - m_read_pos)};
        size_t advance{std::min({length, buffer_available, bytes_until_source_pos})};
        m_read_pos += advance;
        return std::make_pair(&vchBuf[buffer_offset], advance);
    }